

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write-cmake.cpp
# Opt level: O3

bool __thiscall
CMakeWriter::handle_library
          (CMakeWriter *this,ChibiInfo *chibi_info,ChibiLibrary *library,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *traversed_libraries,vector<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_> *libraries)

{
  pointer *pppCVar1;
  pointer pCVar2;
  iterator __position;
  bool bVar3;
  const_iterator cVar4;
  ChibiLibrary *library_00;
  pointer __k;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *line;
  ChibiInfo *line_00;
  ChibiLibrary *local_38;
  
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)traversed_libraries,&library->name);
  __k = (library->library_dependencies).
        super__Vector_base<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>._M_impl.
        super__Vector_impl_data._M_start;
  pCVar2 = (library->library_dependencies).
           super__Vector_base<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__k != pCVar2) {
    do {
      line = traversed_libraries;
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&traversed_libraries->_M_t,&__k->name);
      if (((_Rb_tree_header *)cVar4._M_node ==
           &(traversed_libraries->_M_t)._M_impl.super__Rb_tree_header) &&
         (2 < __k->type - kType_Local)) {
        if (__k->type != kType_Generated) {
          report_error((char *)line,"internal error: unknown library dependency type");
          return false;
        }
        line_00 = chibi_info;
        library_00 = ChibiInfo::find_library(chibi_info,(__k->name)._M_dataplus._M_p);
        if (library_00 == (ChibiLibrary *)0x0) {
          report_error((char *)line_00,"failed to find library dependency: %s for target %s",
                       (__k->name)._M_dataplus._M_p,(library->name)._M_dataplus._M_p);
          return false;
        }
        bVar3 = handle_library(this,chibi_info,library_00,traversed_libraries,libraries);
        if (!bVar3) {
          return false;
        }
      }
      __k = __k + 1;
    } while (__k != pCVar2);
  }
  __position._M_current =
       (libraries->super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (libraries->super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_38 = library;
    std::vector<ChibiLibrary*,std::allocator<ChibiLibrary*>>::_M_realloc_insert<ChibiLibrary*>
              ((vector<ChibiLibrary*,std::allocator<ChibiLibrary*>> *)libraries,__position,&local_38
              );
  }
  else {
    *__position._M_current = library;
    pppCVar1 = &(libraries->super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  return true;
}

Assistant:

bool handle_library(const ChibiInfo & chibi_info, ChibiLibrary & library, std::set<std::string> & traversed_libraries, std::vector<ChibiLibrary*> & libraries)
	{
	#if 0
		if (library.isExecutable)
			printf("handle_app: %s\n", library.name.c_str());
		else
			printf("handle_lib: %s\n", library.name.c_str());
	#endif
	
		traversed_libraries.insert(library.name);
		
		// recurse library dependencies
		
		for (auto & library_dependency : library.library_dependencies)
		{
			if (traversed_libraries.count(library_dependency.name) != 0)
				continue;
			
			if (library_dependency.type == ChibiLibraryDependency::kType_Generated)
			{
				ChibiLibrary * found_library = chibi_info.find_library(library_dependency.name.c_str());
				
				if (found_library == nullptr)
				{
					report_error(nullptr, "failed to find library dependency: %s for target %s", library_dependency.name.c_str(), library.name.c_str());
					return false;
				}
				else
				{
					if (handle_library(chibi_info, *found_library, traversed_libraries, libraries) == false)
						return false;
				}
			}
			else if (library_dependency.type == ChibiLibraryDependency::kType_Local)
			{
				// nothing to do here
			}
			else if (library_dependency.type == ChibiLibraryDependency::kType_Find)
			{
				// nothing to do here
			}
			else if (library_dependency.type == ChibiLibraryDependency::kType_Global)
			{
				// nothing to do here
			}
			else
			{
				report_error(nullptr, "internal error: unknown library dependency type");
				return false;
			}
		}
		
		libraries.push_back(&library);
		
		return true;
	}